

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlackCard.cpp
# Opt level: O1

void __thiscall BlackCard::PrintCardStats(BlackCard *this)

{
  Type *pTVar1;
  pointer pcVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  string *psVar6;
  string *psVar7;
  long lVar8;
  long *plVar9;
  char *pcVar10;
  
  if (this->type != HOLDING) {
    if (this->type != PERSONALITY) {
      exit(-1);
    }
    Personality::PrintPersonality((Personality *)this);
    return;
  }
  plVar9 = &std::cout;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Card: ",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)this[1].super_Card._vptr_Card,
                      (long)this[1].super_Card.name._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost: ",6);
  iVar3 = (*(this->super_Card)._vptr_Card[4])(this);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Holding Type: ",0xe);
  switch(*(undefined4 *)((long)&this[1].super_Card.name.field_2 + 8)) {
  case 1:
    pcVar10 = "Plain";
    goto LAB_0010c613;
  case 2:
    pcVar10 = "Mine";
    lVar8 = 4;
    break;
  case 3:
    pcVar10 = "Gold Mine";
    lVar8 = 9;
    break;
  case 4:
    pcVar10 = "Crystal Mine";
    lVar8 = 0xc;
    break;
  case 5:
    pcVar10 = "Farms";
LAB_0010c613:
    lVar8 = 5;
    break;
  case 6:
    pcVar10 = "Gifts and Favour";
    lVar8 = 0x10;
    break;
  default:
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if ((char)this[1].super_Card.cost == '\x01') {
    pcVar10 = "Tapped: yes";
    lVar8 = 0xb;
  }
  else {
    pcVar10 = "Tapped: no";
    lVar8 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  if (*(char *)((long)&this[1].super_Card.cost + 1) == '\x01') {
    pcVar10 = "Revealed: yes";
    lVar8 = 0xd;
  }
  else {
    pcVar10 = "Revealed: no";
    lVar8 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Harvest Value: ",0xf);
  iVar3 = (*(this->super_Card)._vptr_Card[7])(this);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  lVar8 = *(long *)&this[1].super_Card.type;
  pcVar2 = this[1].name._M_dataplus._M_p;
  if (lVar8 == 0 && pcVar2 == (pointer)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Holding is not in a chain",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    plVar9 = (long *)std::ostream::flush();
    goto LAB_0010c91f;
  }
  pTVar1 = &this[1].super_Card.type;
  psVar6 = &this[1].name;
  if (lVar8 == 0 || pcVar2 == (pointer)0x0) {
    if (lVar8 == 0) {
      if (*(long *)(pcVar2 + 0xa0) == 0) {
        plVar5 = &std::cout;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding connected with the subHolding ",0x26);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
        psVar7 = getName_abi_cxx11_((BlackCard *)(psVar6->_M_dataplus)._M_p);
        plVar5 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cout,(psVar7->_M_dataplus)._M_p,
                                    psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,"and ",4);
        psVar6 = (string *)((psVar6->_M_dataplus)._M_p + 0xa0);
      }
    }
    else {
      if (*(long *)(lVar8 + 0x98) == 0) {
        plVar5 = &std::cout;
        pcVar10 = "Holding connected with the upperholding ";
        lVar8 = 0x28;
        goto LAB_0010c8d8;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
      psVar6 = getName_abi_cxx11_(*(BlackCard **)pTVar1);
      plVar5 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,(psVar6->_M_dataplus)._M_p,
                                  psVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,"and ",4);
      psVar6 = (string *)(*(long *)pTVar1 + 0x98);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Holding in complete chain with ",0x1f);
    psVar6 = getName_abi_cxx11_((BlackCard *)(psVar6->_M_dataplus)._M_p);
    plVar5 = (long *)std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,(psVar6->_M_dataplus)._M_p,
                                psVar6->_M_string_length);
    pcVar10 = "and ";
    lVar8 = 4;
LAB_0010c8d8:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar5,pcVar10,lVar8);
    psVar6 = (string *)pTVar1;
  }
  psVar6 = getName_abi_cxx11_((BlackCard *)(psVar6->_M_dataplus)._M_p);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)plVar5,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
LAB_0010c91f:
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  return;
}

Assistant:

void BlackCard::PrintCardStats()                                //defines type of card and calls proper print function for that type
{
    if (type == PERSONALITY)
    {
        Personality* pers = reinterpret_cast<Personality*>(this);
        pers->PrintPersonality();

        pers = nullptr;
        delete pers;
    }
    else if (type == HOLDING)
    {
        Holding * hold = reinterpret_cast<Holding*>(this);
        hold->PrintHolding();

        hold = nullptr;
        delete hold;
    }
    else
        exit(-1);
}